

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fuzz.c
# Opt level: O1

void test_fuzz_cpio(void)

{
  test_fuzz(test_fuzz_cpio::filesets);
  return;
}

Assistant:

DEFINE_TEST(test_fuzz_cpio)
{
	static const char *fileset1[] = {
		"test_read_format_cpio_bin_be.cpio",
		NULL
	};
	static const char *fileset2[] = {
		"test_read_format_cpio_bin_le.cpio",
		NULL
	};
	static const char *fileset3[] = {
		/* Test RPM unwrapper */
		"test_read_format_cpio_svr4_gzip_rpm.rpm",
		NULL
	};
	static const struct files filesets[] = {
		{0, fileset1},
		{0, fileset2},
		{0, fileset3},
		{1, NULL}
	};
	test_fuzz(filesets);
}